

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

bool __thiscall
cmConditionEvaluator::HandleLevel3
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  iterator iVar1;
  bool bVar2;
  _Self __tmp_1;
  cmConditionEvaluator *this_00;
  _Self __tmp;
  iterator iVar3;
  int reducible;
  iterator argP2;
  iterator arg;
  int local_84;
  iterator local_80;
  iterator local_78;
  cmConditionEvaluator *local_70;
  iterator local_68;
  string *local_60;
  MessageType *local_58;
  string local_50;
  
  local_70 = this;
  local_60 = errorString;
  local_58 = status;
  do {
    local_84 = 0;
    iVar3._M_node =
         (newArgs->
         super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
         _M_impl._M_node.super__List_node_base._M_next;
    local_80._M_node = (_List_node_base *)0x0;
    if (iVar3._M_node == (_List_node_base *)newArgs) {
      return true;
    }
    do {
      local_68._M_node = iVar3._M_node;
      if ((iVar3._M_node != (_List_node_base *)newArgs) &&
         (local_68._M_node = (iVar3._M_node)->_M_next, local_80._M_node = local_68._M_node,
         local_68._M_node != (_List_node_base *)newArgs)) {
        local_80._M_node = (local_68._M_node)->_M_next;
      }
      iVar1._M_node = local_68._M_node;
      if (local_68._M_node != (_List_node_base *)newArgs) {
        local_78._M_node = iVar3._M_node;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"NOT","");
        bVar2 = IsKeyword(local_70,&local_50,(cmExpandedCommandArgument *)(iVar3._M_node + 1));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (bVar2) {
          this_00 = local_70;
          bVar2 = GetBooleanValueWithAutoDereference
                            (local_70,(cmExpandedCommandArgument *)(iVar1._M_node + 1),local_60,
                             local_58,false);
          HandlePredicate(this_00,!bVar2,&local_84,&local_78,newArgs,&local_68,&local_80);
          iVar3._M_node = local_78._M_node;
        }
      }
      iVar3._M_node =
           (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
            &(iVar3._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (iVar3._M_node != (_List_node_base *)newArgs);
  } while (local_84 != 0);
  return true;
}

Assistant:

bool cmConditionEvaluator::HandleLevel3(cmArgumentList &newArgs,
                  std::string &errorString,
                  cmake::MessageType &status)
{
  int reducible;
  do
    {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end())
      {
      argP1 = arg;
      IncrementArguments(newArgs,argP1,argP2);
      if (argP1 != newArgs.end() && IsKeyword("NOT", *arg))
        {
        bool rhs = this->GetBooleanValueWithAutoDereference(*argP1,
                                                      errorString,
                                                      status);
        this->HandlePredicate(!rhs, reducible, arg, newArgs, argP1, argP2);
        }
      ++arg;
      }
    }
  while (reducible);
  return true;
}